

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler_himawari8.cc
# Opt level: O3

string * __thiscall
Himawari8ImageHandler::getBasename_abi_cxx11_
          (string *__return_storage_ptr__,Himawari8ImageHandler *this,File *f)

{
  size_t sVar1;
  runtime_error *this_00;
  int *in_R9;
  string text;
  string local_70;
  char local_4c [4];
  undefined1 local_48 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_30;
  
  lrit::getHeader<lrit::AnnotationHeader>((AnnotationHeader *)local_48,&f->header_,&f->m_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._8_8_ == &local_30) {
    local_70.field_2._8_8_ = local_30._8_8_;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  }
  else {
    local_70._M_dataplus._M_p = (pointer)local_48._8_8_;
  }
  local_70.field_2._M_allocated_capacity = local_30._M_allocated_capacity;
  local_70._M_string_length = local_48._16_8_;
  sVar1 = util::findLast(&local_70,'_');
  if (sVar1 != 0xffffffffffffffff) {
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    return __return_storage_ptr__;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_4c[0] = 'y';
  local_4c[1] = '\0';
  local_4c[2] = '\0';
  local_4c[3] = '\0';
  util::str<char[48],char[107],char[2],int>
            ((string *)local_48,(util *)"Assertion `pos != std::string::npos` failed at ",
             (char (*) [48])
             "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/src/goesproc/handler_himawari8.cc"
             ,(char (*) [107])0x1afe61,(char (*) [2])local_4c,in_R9);
  std::runtime_error::runtime_error(this_00,(string *)local_48);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::string Himawari8ImageHandler::getBasename(const lrit::File& f) const {
  auto text = f.getHeader<lrit::AnnotationHeader>().text;

  // Find last _ in annotation text and use this prefix
  // as identification for this segmented image.
  // Example annotation: IMG_DK01VIS_201712162250_003.lrit
  auto pos = findLast(text, '_');
  ASSERT(pos != std::string::npos);
  return text.substr(0, pos);
}